

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_corrupt_utf8(void)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint __fd;
  void *pvVar4;
  ssize_t sVar5;
  long lVar6;
  char *pcVar7;
  undefined8 *__n;
  undefined8 uVar8;
  undefined8 *puVar9;
  ulong uVar10;
  void *__s2;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  uint uVar14;
  undefined8 *puVar15;
  int *unaff_R12;
  undefined8 *puVar16;
  undefined8 *puVar17;
  undefined8 *puVar18;
  uint *__seed;
  bson_t b;
  undefined1 auStack_fbc [12];
  undefined8 *puStack_fb0;
  undefined8 *puStack_fa8;
  undefined8 *puStack_fa0;
  undefined8 *puStack_f98;
  uint *puStack_f90;
  code *pcStack_f88;
  undefined8 *puStack_f08;
  undefined8 *puStack_f00;
  undefined8 *puStack_ef8;
  int iStack_eec;
  undefined8 *puStack_ee8;
  void *pvStack_ee0;
  undefined8 *puStack_ed8;
  long lStack_ed0;
  uint uStack_ec4;
  char acStack_ec0 [32];
  char acStack_ea0 [32];
  undefined8 uStack_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 uStack_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 uStack_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 uStack_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined1 auStack_db8 [648];
  undefined8 *puStack_b30;
  int *piStack_b28;
  code *apcStack_b08 [16];
  int iStack_a84;
  int aiStack_a80 [52];
  undefined1 auStack_9b0 [648];
  char *pcStack_728;
  code *apcStack_708 [16];
  long alStack_688 [47];
  char *pcStack_510;
  code *apcStack_508 [16];
  long alStack_488 [47];
  void *pvStack_310;
  code *pcStack_308;
  undefined1 auStack_300 [368];
  void *pvStack_190;
  code *pcStack_188;
  undefined1 auStack_180 [368];
  
  pcStack_188 = (code *)0x12dc5e;
  pvVar4 = (void *)bson_malloc0(0x400);
  pcStack_188 = (code *)0x12dc71;
  iVar2 = open("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/test56.bson"
               ,0);
  if (iVar2 == -1) {
    pcStack_188 = (code *)0x12dcca;
    test_bson_corrupt_utf8_cold_4();
LAB_0012dcca:
    pcStack_188 = (code *)0x12dccf;
    test_bson_corrupt_utf8_cold_1();
LAB_0012dccf:
    pcStack_188 = (code *)0x12dcd4;
    test_bson_corrupt_utf8_cold_2();
  }
  else {
    pcStack_188 = (code *)0x12dc85;
    sVar5 = read(iVar2,pvVar4,0x400);
    if (sVar5 != 0x2a) goto LAB_0012dcca;
    pcStack_188 = (code *)0x12dc9b;
    cVar1 = bson_init_static(auStack_180,pvVar4,0x2a);
    if (cVar1 == '\0') goto LAB_0012dccf;
    pcStack_188 = (code *)0x12dca9;
    lVar6 = bson_as_json(auStack_180);
    if (lVar6 == 0) {
      pcStack_188 = (code *)0x12dcb6;
      bson_destroy(auStack_180);
      pcStack_188 = (code *)0x12dcbe;
      bson_free(pvVar4);
      return;
    }
  }
  pcStack_188 = test_bson_corrupt_binary;
  test_bson_corrupt_utf8_cold_3();
  pcStack_308 = (code *)0x12dcf3;
  pvStack_190 = pvVar4;
  pcStack_188 = (code *)&stack0xfffffffffffffff8;
  pvVar4 = (void *)bson_malloc0(0x400);
  pcStack_308 = (code *)0x12dd06;
  iVar2 = open("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/test57.bson"
               ,0);
  if (iVar2 == -1) {
    pcStack_308 = (code *)0x12dd5f;
    test_bson_corrupt_binary_cold_4();
LAB_0012dd5f:
    pcStack_308 = (code *)0x12dd64;
    test_bson_corrupt_binary_cold_1();
LAB_0012dd64:
    pcStack_308 = (code *)0x12dd69;
    test_bson_corrupt_binary_cold_2();
  }
  else {
    pcStack_308 = (code *)0x12dd1a;
    sVar5 = read(iVar2,pvVar4,0x400);
    if (sVar5 != 0x1a) goto LAB_0012dd5f;
    pcStack_308 = (code *)0x12dd30;
    cVar1 = bson_init_static(auStack_300,pvVar4,0x1a);
    if (cVar1 == '\0') goto LAB_0012dd64;
    pcStack_308 = (code *)0x12dd3e;
    lVar6 = bson_as_json(auStack_300,0);
    if (lVar6 == 0) {
      pcStack_308 = (code *)0x12dd4b;
      bson_destroy(auStack_300);
      pcStack_308 = (code *)0x12dd53;
      bson_free(pvVar4);
      return;
    }
  }
  pcStack_308 = test_bson_as_json_spacing;
  test_bson_corrupt_binary_cold_3();
  alStack_488[0xf] = 0;
  alStack_488[0x10] = 0;
  alStack_488[0xd] = 0;
  alStack_488[0xe] = 0;
  alStack_488[0xb] = 0;
  alStack_488[0xc] = 0;
  alStack_488[9] = 0;
  alStack_488[10] = 0;
  alStack_488[7] = 0;
  alStack_488[8] = 0;
  alStack_488[5] = 0;
  alStack_488[6] = 0;
  alStack_488[3] = 0;
  alStack_488[4] = 0;
  alStack_488[1] = 0x500000003;
  alStack_488[2] = 5;
  apcStack_508[0] = (code *)0x12ddc3;
  pvStack_310 = pvVar4;
  pcStack_308 = (code *)&pcStack_188;
  pcVar7 = (char *)bson_as_json(alStack_488 + 1,alStack_488);
  apcStack_508[0] = (code *)0x12ddd5;
  iVar2 = strcmp(pcVar7,"{ }");
  if (iVar2 == 0) {
    if (alStack_488[0] != 3) goto LAB_0012de56;
    apcStack_508[0] = (code *)0x12dde9;
    bson_free(pcVar7);
    apcStack_508[0] = (code *)0x12de0a;
    bson_append_int32(alStack_488 + 1,"a",1,1);
    apcStack_508[0] = (code *)0x12de17;
    pcVar7 = (char *)bson_as_json(alStack_488 + 1,alStack_488);
    apcStack_508[0] = (code *)0x12de29;
    iVar2 = strcmp(pcVar7,"{ \"a\" : 1 }");
    if (iVar2 != 0) goto LAB_0012de5b;
    if (alStack_488[0] == 0xb) {
      apcStack_508[0] = (code *)0x12de3d;
      bson_free(pcVar7);
      apcStack_508[0] = (code *)0x12de4a;
      bson_destroy(alStack_488 + 1);
      return;
    }
  }
  else {
    apcStack_508[0] = (code *)0x12de56;
    test_bson_as_json_spacing_cold_1();
LAB_0012de56:
    apcStack_508[0] = (code *)0x12de5b;
    test_bson_as_json_spacing_cold_2();
LAB_0012de5b:
    apcStack_508[0] = (code *)0x12de60;
    test_bson_as_json_spacing_cold_3();
  }
  apcStack_508[0] = test_bson_array_as_json;
  test_bson_as_json_spacing_cold_4();
  alStack_688[0xf] = 0;
  alStack_688[0x10] = 0;
  alStack_688[0xd] = 0;
  alStack_688[0xe] = 0;
  alStack_688[0xb] = 0;
  alStack_688[0xc] = 0;
  alStack_688[9] = 0;
  alStack_688[10] = 0;
  alStack_688[7] = 0;
  alStack_688[8] = 0;
  alStack_688[5] = 0;
  alStack_688[6] = 0;
  alStack_688[3] = 0;
  alStack_688[4] = 0;
  alStack_688[1] = 0x500000003;
  alStack_688[2] = 5;
  apcStack_708[0] = (code *)0x12deba;
  pcStack_510 = pcVar7;
  apcStack_508[0] = (code *)&pcStack_308;
  pcVar7 = (char *)bson_array_as_json(alStack_688 + 1,alStack_688);
  apcStack_708[0] = (code *)0x12decc;
  iVar2 = strcmp(pcVar7,"[ ]");
  if (iVar2 == 0) {
    if (alStack_688[0] != 3) goto LAB_0012df4d;
    apcStack_708[0] = (code *)0x12dee0;
    bson_free(pcVar7);
    apcStack_708[0] = (code *)0x12df01;
    bson_append_int32(alStack_688 + 1,"0",1,1);
    apcStack_708[0] = (code *)0x12df0e;
    pcVar7 = (char *)bson_array_as_json(alStack_688 + 1,alStack_688);
    apcStack_708[0] = (code *)0x12df20;
    iVar2 = strcmp(pcVar7,"[ 1 ]");
    if (iVar2 != 0) goto LAB_0012df52;
    if (alStack_688[0] == 5) {
      apcStack_708[0] = (code *)0x12df34;
      bson_free(pcVar7);
      apcStack_708[0] = (code *)0x12df41;
      bson_destroy(alStack_688 + 1);
      return;
    }
  }
  else {
    apcStack_708[0] = (code *)0x12df4d;
    test_bson_array_as_json_cold_1();
LAB_0012df4d:
    apcStack_708[0] = (code *)0x12df52;
    test_bson_array_as_json_cold_2();
LAB_0012df52:
    apcStack_708[0] = (code *)0x12df57;
    test_bson_array_as_json_cold_3();
  }
  apcStack_708[0] = test_bson_json_allow_multiple;
  test_bson_array_as_json_cold_4();
  aiStack_a80[0x1c] = 0;
  aiStack_a80[0x1d] = 0;
  aiStack_a80[0x1e] = 0;
  aiStack_a80[0x1f] = 0;
  aiStack_a80[0x18] = 0;
  aiStack_a80[0x19] = 0;
  aiStack_a80[0x1a] = 0;
  aiStack_a80[0x1b] = 0;
  aiStack_a80[0x14] = 0;
  aiStack_a80[0x15] = 0;
  aiStack_a80[0x16] = 0;
  aiStack_a80[0x17] = 0;
  aiStack_a80[0x10] = 0;
  aiStack_a80[0x11] = 0;
  aiStack_a80[0x12] = 0;
  aiStack_a80[0x13] = 0;
  aiStack_a80[0xc] = 0;
  aiStack_a80[0xd] = 0;
  aiStack_a80[0xe] = 0;
  aiStack_a80[0xf] = 0;
  aiStack_a80[8] = 0;
  aiStack_a80[9] = 0;
  aiStack_a80[10] = 0;
  aiStack_a80[0xb] = 0;
  aiStack_a80[4] = 0;
  aiStack_a80[5] = 0;
  aiStack_a80[6] = 0;
  aiStack_a80[7] = 0;
  aiStack_a80[0] = 3;
  aiStack_a80[1] = 5;
  aiStack_a80[2] = 5;
  aiStack_a80[3] = 0;
  apcStack_b08[0] = (code *)0x12dfef;
  pcStack_728 = pcVar7;
  apcStack_708[0] = (code *)apcStack_508;
  __n = (undefined8 *)
        bson_json_reader_new("{\"a\": 1}{\"b\": 1}",test_bson_json_read_cb_helper,0,0,0);
  apcStack_b08[0] = (code *)0x12e007;
  lVar6 = bson_json_reader_new("{\"a\": 1}{\"b\": 1}",test_bson_json_read_cb_helper,0,1,0);
  if (__n == (undefined8 *)0x0) {
    apcStack_b08[0] = (code *)0x12e294;
    test_bson_json_allow_multiple_cold_14();
LAB_0012e294:
    apcStack_b08[0] = (code *)0x12e299;
    test_bson_json_allow_multiple_cold_13();
LAB_0012e299:
    apcStack_b08[0] = (code *)0x12e2b1;
    test_bson_json_allow_multiple_cold_1();
LAB_0012e2b1:
    apcStack_b08[0] = (code *)0x12e2b6;
    test_bson_json_allow_multiple_cold_2();
LAB_0012e2b6:
    apcStack_b08[0] = (code *)0x12e2ce;
    test_bson_json_allow_multiple_cold_3();
LAB_0012e2ce:
    apcStack_b08[0] = (code *)0x12e2d3;
    test_bson_json_allow_multiple_cold_4();
LAB_0012e2d3:
    apcStack_b08[0] = (code *)0x12e2eb;
    test_bson_json_allow_multiple_cold_5();
LAB_0012e2eb:
    apcStack_b08[0] = (code *)0x12e2f0;
    test_bson_json_allow_multiple_cold_6();
LAB_0012e2f0:
    apcStack_b08[0] = (code *)0x12e308;
    test_bson_json_allow_multiple_cold_7();
LAB_0012e308:
    apcStack_b08[0] = (code *)0x12e30d;
    test_bson_json_allow_multiple_cold_8();
LAB_0012e30d:
    apcStack_b08[0] = (code *)0x12e325;
    test_bson_json_allow_multiple_cold_9();
LAB_0012e325:
    apcStack_b08[0] = (code *)0x12e32a;
    test_bson_json_allow_multiple_cold_10();
  }
  else {
    if (lVar6 == 0) goto LAB_0012e294;
    apcStack_b08[0] = (code *)0x12e034;
    iVar2 = bson_json_reader_read(__n,aiStack_a80,auStack_9b0);
    if (iVar2 != 1) goto LAB_0012e299;
    apcStack_b08[0] = (code *)0x12e042;
    uVar8 = bson_bcone_magic();
    unaff_R12 = &iStack_a84;
    apcStack_b08[0] = (code *)0x12e06e;
    bcon_extract(aiStack_a80,"a",uVar8,0xf,unaff_R12,0);
    if (iStack_a84 != 1) goto LAB_0012e2b1;
    unaff_R12 = aiStack_a80;
    apcStack_b08[0] = (code *)0x12e08b;
    bson_reinit(unaff_R12);
    apcStack_b08[0] = (code *)0x12e09e;
    iVar2 = bson_json_reader_read(__n,unaff_R12,auStack_9b0);
    if (iVar2 != 1) goto LAB_0012e2b6;
    unaff_R12 = &iStack_a84;
    apcStack_b08[0] = (code *)0x12e0d0;
    bcon_extract(aiStack_a80,"b",uVar8,0xf,unaff_R12,0);
    if (iStack_a84 != 1) goto LAB_0012e2ce;
    unaff_R12 = aiStack_a80;
    apcStack_b08[0] = (code *)0x12e0ed;
    bson_reinit(unaff_R12);
    apcStack_b08[0] = (code *)0x12e100;
    iVar2 = bson_json_reader_read(__n,unaff_R12,auStack_9b0);
    if (iVar2 != 1) goto LAB_0012e2d3;
    unaff_R12 = &iStack_a84;
    apcStack_b08[0] = (code *)0x12e132;
    bcon_extract(aiStack_a80,"a",uVar8,0xf,unaff_R12,0);
    if (iStack_a84 != 1) goto LAB_0012e2eb;
    unaff_R12 = aiStack_a80;
    apcStack_b08[0] = (code *)0x12e14f;
    bson_reinit(unaff_R12);
    apcStack_b08[0] = (code *)0x12e162;
    iVar2 = bson_json_reader_read(lVar6,unaff_R12,auStack_9b0);
    if (iVar2 != 1) goto LAB_0012e2f0;
    unaff_R12 = &iStack_a84;
    apcStack_b08[0] = (code *)0x12e194;
    bcon_extract(aiStack_a80,"a",uVar8,0xf,unaff_R12,0);
    if (iStack_a84 != 1) goto LAB_0012e308;
    unaff_R12 = aiStack_a80;
    apcStack_b08[0] = (code *)0x12e1b1;
    bson_reinit(unaff_R12);
    apcStack_b08[0] = (code *)0x12e1c4;
    iVar2 = bson_json_reader_read(lVar6,unaff_R12,auStack_9b0);
    if (iVar2 != 1) goto LAB_0012e30d;
    unaff_R12 = &iStack_a84;
    apcStack_b08[0] = (code *)0x12e1f6;
    bcon_extract(aiStack_a80,"b",uVar8,0xf,unaff_R12,0);
    if (iStack_a84 != 1) goto LAB_0012e325;
    unaff_R12 = aiStack_a80;
    apcStack_b08[0] = (code *)0x12e213;
    bson_reinit(unaff_R12);
    apcStack_b08[0] = (code *)0x12e226;
    iVar2 = bson_json_reader_read(lVar6,unaff_R12,auStack_9b0);
    if (iVar2 == 1) {
      unaff_R12 = &iStack_a84;
      apcStack_b08[0] = (code *)0x12e258;
      bcon_extract(aiStack_a80,"a",uVar8,0xf,unaff_R12,0);
      if (iStack_a84 == 1) {
        apcStack_b08[0] = (code *)0x12e26d;
        bson_json_reader_destroy(__n);
        apcStack_b08[0] = (code *)0x12e275;
        bson_json_reader_destroy(lVar6);
        apcStack_b08[0] = (code *)0x12e282;
        bson_destroy(aiStack_a80);
        return;
      }
      goto LAB_0012e342;
    }
  }
  apcStack_b08[0] = (code *)0x12e342;
  test_bson_json_allow_multiple_cold_11();
LAB_0012e342:
  apcStack_b08[0] = test_bson_json_read_buffering;
  test_bson_json_allow_multiple_cold_12();
  uStack_e10 = 0;
  uStack_e08 = 0;
  uStack_e20 = 0;
  uStack_e18 = 0;
  uStack_e30 = 0;
  uStack_e28 = 0;
  uStack_e40 = 0;
  uStack_e38 = 0;
  uStack_e50 = 0;
  uStack_e48 = 0;
  uStack_e60 = 0;
  uStack_e58 = 0;
  uStack_e70 = 0;
  uStack_e68 = 0;
  uStack_e80 = 0x500000003;
  uStack_e78 = 5;
  __seed = &uStack_ec4;
  uStack_ec4 = 0x2a;
  pcStack_f88 = (code *)0x12e3b0;
  puStack_b30 = __n;
  piStack_b28 = unaff_R12;
  apcStack_b08[0] = (code *)apcStack_708;
  puStack_f00 = (undefined8 *)bson_string_new(0);
  puVar16 = (undefined8 *)0x1;
LAB_0012e3be:
  lStack_ed0 = (long)puVar16 * 8;
  iVar2 = 0;
  puStack_ed8 = puVar16;
LAB_0012e3d8:
  pcStack_f88 = (code *)0x12e3e4;
  iStack_eec = iVar2;
  puVar9 = (undefined8 *)bson_malloc(lStack_ed0);
  puVar17 = (undefined8 *)0x0;
  puStack_f08 = puVar9;
  do {
    pcStack_f88 = (code *)0x12e3f4;
    uVar8 = bson_new();
    puVar9[(long)puVar17] = uVar8;
    pcStack_f88 = (code *)0x12e400;
    iVar2 = rand_r(__seed);
    if (0 < iVar2 % 5) {
      __n = (undefined8 *)0x0;
      do {
        uVar8 = puStack_f08[(long)puVar17];
        pcStack_f88 = (code *)0x12e439;
        iVar3 = rand_r(__seed);
        uVar13 = (long)iVar3 + ((ulong)(long)iVar3 / 3 & 0xfffffffffffffff8) * -3;
        if (uVar13 != 0) {
          uVar10 = 0;
          do {
            acStack_ec0[uVar10] = (char)uVar10 + 'a';
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar13);
        }
        acStack_ec0[uVar13] = '\0';
        pcStack_f88 = (code *)0x12e480;
        iVar3 = rand_r(__seed);
        uVar13 = (long)iVar3 + ((ulong)(long)iVar3 / 3 & 0xfffffffffffffff8) * -3;
        if (uVar13 != 0) {
          uVar10 = 0;
          do {
            acStack_ea0[uVar10] = (char)uVar10 + 'a';
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar13);
        }
        acStack_ea0[uVar13] = '\0';
        pcStack_f88 = (code *)0x12e4e2;
        bson_append_utf8(uVar8,acStack_ec0,0xffffffff,acStack_ea0,0xffffffff);
        uVar8 = puStack_f08[(long)puVar17];
        pcStack_f88 = (code *)0x12e4f3;
        iVar3 = rand_r(__seed);
        uVar13 = (long)iVar3 + ((ulong)(long)iVar3 / 3 & 0xfffffffffffffff8) * -3;
        if (uVar13 != 0) {
          uVar10 = 0;
          do {
            acStack_ec0[uVar10] = (char)uVar10 + 'a';
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar13);
        }
        acStack_ec0[uVar13] = '\0';
        pcStack_f88 = (code *)0x12e53a;
        iVar3 = rand_r(__seed);
        pcStack_f88 = (code *)0x12e56f;
        bson_append_int32(uVar8,acStack_ec0,0xffffffff,
                          iVar3 + ((int)((long)iVar3 * 0x40000001 >> 0x3d) - (iVar3 >> 0x1f)) *
                                  -0x7fffffff);
        uVar14 = (int)__n + 1;
        __n = (undefined8 *)(ulong)uVar14;
      } while (uVar14 != iVar2 % 5);
    }
    puVar9 = puStack_f08;
    pcStack_f88 = (code *)0x12e58a;
    lVar6 = bson_as_json(puStack_f08[(long)puVar17],0);
    if (lVar6 == 0) goto LAB_0012e787;
    pcStack_f88 = (code *)0x12e5a6;
    bson_string_append(puStack_f00);
    pcStack_f88 = (code *)0x12e5ae;
    bson_free(lVar6);
    puVar16 = puStack_ed8;
    puVar17 = (undefined8 *)((long)puVar17 + 1);
  } while (puVar17 != puStack_ed8);
  pcStack_f88 = (code *)0x12e5ca;
  iVar2 = rand_r(__seed);
  pcStack_f88 = (code *)0x12e5f6;
  puVar17 = (undefined8 *)bson_json_data_reader_new(1,(ulong)(long)iVar2 % 100);
  pcStack_f88 = (code *)0x12e60f;
  bson_json_data_reader_ingest(puVar17,*puStack_f00,*(undefined4 *)(puStack_f00 + 1));
  puVar15 = (undefined8 *)0x0;
  while( true ) {
    __n = &uStack_e80;
    pcStack_f88 = (code *)0x12e629;
    puStack_ef8 = puVar15;
    bson_reinit(__n);
    pcStack_f88 = (code *)0x12e63c;
    iVar2 = bson_json_reader_read(puVar17,__n,auStack_db8);
    if (iVar2 == -1) break;
    puVar18 = puVar9;
    if (iVar2 == 0) goto LAB_0012e8cc;
    pcStack_f88 = (code *)0x12e655;
    puStack_ee8 = (undefined8 *)bson_get_data(__n);
    __n = puStack_ef8;
    pcStack_f88 = (code *)0x12e66e;
    pvStack_ee0 = (void *)bson_get_data(puVar9[(long)puStack_ef8]);
    if (*(int *)(puVar9[(long)__n] + 4) != uStack_e80._4_4_) goto LAB_0012e78c;
    pcStack_f88 = (code *)0x12e68f;
    pvVar4 = (void *)bson_get_data();
    pcStack_f88 = (code *)0x12e69f;
    __s2 = (void *)bson_get_data(&uStack_e80);
    pcStack_f88 = (code *)0x12e6b1;
    iVar2 = bcmp(pvVar4,__s2,(ulong)*(uint *)(puVar9[(long)__n] + 4));
    puVar16 = puStack_ed8;
    if (iVar2 != 0) goto LAB_0012e78c;
    puVar15 = (undefined8 *)((long)__n + 1);
    __n = &uStack_e80;
    if (puStack_ed8 == puVar15) goto code_r0x0012e6d8;
  }
  pcStack_f88 = (code *)0x12e787;
  test_bson_json_read_buffering_cold_2();
LAB_0012e787:
  pcStack_f88 = (code *)0x12e78c;
  test_bson_json_read_buffering_cold_9();
LAB_0012e78c:
  __seed = (uint *)&uStack_e80;
  pcStack_f88 = (code *)0x12e79e;
  uVar8 = bson_as_canonical_extended_json(__seed,0);
  pcStack_f88 = (code *)0x12e7af;
  uVar11 = bson_as_canonical_extended_json(puVar9[(long)__n],0);
  puVar15 = puStack_ee8;
  uVar13 = 0xffffffff;
  if (uStack_e80._4_4_ == 0) goto LAB_0012e7f9;
  uVar10 = 0;
  goto LAB_0012e7e0;
  while( true ) {
    if (*(char *)((long)puStack_ee8 + uVar10) != *(char *)((long)pvStack_ee0 + uVar10)) {
      uVar13 = uVar10 & 0xffffffff;
      break;
    }
    uVar10 = uVar10 + 1;
    if (uStack_e80._4_4_ == (uint)uVar10) break;
LAB_0012e7e0:
    if (*(int *)(puVar9[(long)__n] + 4) == (int)uVar10) break;
  }
LAB_0012e7f9:
  if ((int)uVar13 == -1) {
    uVar14 = uStack_e80._4_4_;
    if (uStack_e80._4_4_ < *(uint *)(puStack_f08[(long)puStack_ef8] + 4)) {
      uVar14 = *(uint *)(puStack_f08[(long)puStack_ef8] + 4);
    }
    uVar13 = (ulong)(uVar14 - 1);
  }
  pcStack_f88 = (code *)0x12e839;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar13,uVar8,uVar11);
  pcStack_f88 = (code *)0x12e851;
  uVar14 = open("failure.bad.bson",0x42,0x1a0);
  puVar18 = (undefined8 *)(ulong)uVar14;
  pcStack_f88 = (code *)0x12e86c;
  __fd = open("failure.expected.bson",0x42,0x1a0);
  __n = puVar15;
  puVar16 = puVar9;
  if (uVar14 == 0xffffffff) {
LAB_0012e8d1:
    pcStack_f88 = (code *)0x12e8d6;
    test_bson_json_read_buffering_cold_7();
LAB_0012e8d6:
    pcStack_f88 = (code *)0x12e8db;
    test_bson_json_read_buffering_cold_6();
LAB_0012e8db:
    pcStack_f88 = (code *)0x12e8e0;
    test_bson_json_read_buffering_cold_3();
  }
  else {
    __seed = (uint *)(ulong)__fd;
    if (__fd == 0xffffffff) goto LAB_0012e8d6;
    puVar16 = (undefined8 *)(uStack_e80 >> 0x20);
    pcStack_f88 = (code *)0x12e890;
    puVar9 = (undefined8 *)write(uVar14,puVar15,(size_t)puVar16);
    if (puVar9 != puVar16) goto LAB_0012e8db;
    __n = (undefined8 *)(ulong)*(uint *)(puStack_f08[(long)puStack_ef8] + 4);
    pcStack_f88 = (code *)0x12e8bc;
    puVar9 = (undefined8 *)write(__fd,pvStack_ee0,(size_t)__n);
    if (puVar9 == __n) {
      pcStack_f88 = (code *)0x12e8cc;
      test_bson_json_read_buffering_cold_5();
LAB_0012e8cc:
      pcStack_f88 = (code *)0x12e8d1;
      test_bson_json_read_buffering_cold_1();
      goto LAB_0012e8d1;
    }
  }
  pcStack_f88 = (code *)0x12e8e5;
  test_bson_json_read_buffering_cold_4();
  goto LAB_0012e8e5;
code_r0x0012e6d8:
  pcStack_f88 = (code *)0x12e6eb;
  iVar2 = bson_json_reader_read(puVar17,__n,auStack_db8);
  if (iVar2 != 0) {
LAB_0012e8e5:
    pcStack_f88 = test_bson_json_read;
    test_bson_json_read_buffering_cold_8();
    puStack_fb0 = __n;
    puStack_fa8 = puVar16;
    puStack_fa0 = puVar17;
    puStack_f98 = puVar18;
    puStack_f90 = __seed;
    pcStack_f88 = (code *)apcStack_b08;
    bson_oid_init_from_string(auStack_fbc,"000000000000000000000000");
    uVar8 = bson_bcon_magic();
    uVar11 = bcon_new(0x1a9fbe77,0,"foo","bar","bar",uVar8,0xf,0x3035,"baz",uVar8,1,"map","{","a",
                      uVar8,0xf,1,"}","array","[",uVar8,0xf,1,uVar8,0xf,2,uVar8,0xf,3,uVar8,0xf,4,
                      "]","null",uVar8,9,"boolean",uVar8,7,1,"oid",uVar8,6,auStack_fbc,"binary",
                      uVar8,4,0,"deadbeef",8,"regex",uVar8,10,"foo|bar","ism","date",uVar8,8,10000,
                      "ref","{","$ref",uVar8,0,"foo","$id",uVar8,6,auStack_fbc);
    uVar12 = bcon_new(0,"after","b",0);
    iVar2 = 0x147e7e;
    uVar8 = bcon_new(0,"twice",uVar8,7,1,0);
    _test_bson_json_read_compare
              ("{ \n      \"foo\" : \"bar\", \n      \"bar\" : 12341, \n      \"baz\" : 123.456, \n      \"map\" : { \"a\" : 1 }, \n      \"array\" : [ 1, 2, 3, 4 ], \n      \"null\" : null, \n      \"boolean\" : true, \n      \"oid\" : { \n        \"$oid\" : \"000000000000000000000000\" \n      }, \n      \"binary\" : { \n        \"$type\" : \"00\", \n        \"$binary\" : \"ZGVhZGJlZWY=\" \n      }, \n      \"regex\" : { \n        \"$regularExpression\" : { \n          \"pattern\": \"foo|bar\", \"options\" : \"ism\" \n        } \n      }, \n      \"date\" : { \n        \"$date\" : \"1970-01-01T00:00:10Z\" \n      }, \n      \"ref\" : { \n        \"$ref\" : \"foo\", \n        \"$id\" : {\"$oid\": \"000000000000000000000000\"} \n      }, \n      \"undefined\" : { \n        \"$undefined\" : true \n      }, \n      \"minkey\" : { \n        \"$minKey\" : 1 \n      }, \n      \"maxkey\" : { \n        \"$maxKey\" : 1 \n      }, \n      \"timestamp\" : { \n        \"$timestamp\" : { \n           \"t\" : 100, \n           \"i\" : 1000 \n        } \n      } \n   } { \"after\": \"b\" } { \"twice\" : true }"
               ,iVar2,uVar11,uVar12,uVar8,0);
    return;
  }
  pcStack_f88 = (code *)0x12e6fb;
  bson_json_reader_destroy(puVar17);
  pcStack_f88 = (code *)0x12e70a;
  bson_string_truncate(puStack_f00);
  __n = (undefined8 *)0x0;
  do {
    pcStack_f88 = (code *)0x12e715;
    bson_destroy(puVar9[(long)__n]);
    __n = (undefined8 *)((long)__n + 1);
  } while (puVar16 != __n);
  pcStack_f88 = (code *)0x12e725;
  bson_free(puVar9);
  iVar2 = iStack_eec + 1;
  if (iVar2 == 0x32) goto code_r0x0012e73f;
  goto LAB_0012e3d8;
code_r0x0012e73f:
  puVar16 = (undefined8 *)((long)puVar16 + 1);
  if (puVar16 == (undefined8 *)0xa) {
    pcStack_f88 = (code *)0x12e75e;
    bson_string_free(puStack_f00,1);
    pcStack_f88 = (code *)0x12e76b;
    bson_destroy(&uStack_e80);
    return;
  }
  goto LAB_0012e3be;
}

Assistant:

static void
test_bson_corrupt_utf8 (void)
{
   uint8_t *buf;
   bson_t b;
   size_t buflen = 1024;
   char *str;
   int fd;
   ssize_t r;

   buf = bson_malloc0 (buflen);

   fd = bson_open (BINARY_DIR "/test56.bson", O_RDONLY);
   BSON_ASSERT (-1 != fd);

   r = bson_read (fd, buf, buflen);
   BSON_ASSERT (r == 42);

   r = bson_init_static (&b, buf, (uint32_t) r);
   BSON_ASSERT (r);

   str = bson_as_json (&b, NULL);
   BSON_ASSERT (!str);

   bson_destroy (&b);
   bson_free (buf);
}